

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmidl.c
# Opt level: O1

_Bool tmidl_parser_parse(tmidl_parser_o *parser,char *input,tmidl_callbacks_i *callbacks,
                        void *user_context)

{
  int *piVar1;
  undefined8 *puVar2;
  int iVar3;
  size_t sVar4;
  tmidl_function_t *ptVar5;
  char *pcVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  tmidl_diagnostic_t diagnostic;
  mpc_result_t r;
  tmidl_declaration_t local_80;
  int local_58;
  int local_54;
  tmidl_callbacks_i *local_50;
  long local_48;
  mpc_result_t local_40;
  long local_38;
  
  local_54 = mpc_parse("input",input,parser->module_parser,&local_40);
  if (local_54 == 0) {
    pcVar6 = mpc_err_string(local_40.error);
    local_80.type = TMIDL_ITEM_INTERFACE;
    iVar3 = (int)((local_40.error)->state).pos;
    local_80.doc = (char *)CONCAT44(iVar3 + 1,iVar3);
    local_80.name = pcVar6;
    (*callbacks->on_diagnostic)((tmidl_diagnostic_t *)&local_80,user_context);
    free(pcVar6);
    mpc_err_delete(local_40.error);
  }
  else {
    if (0 < (int)((local_40.error)->state).row) {
      lVar9 = ((local_40.error)->state).pos;
      lVar7 = 0;
      local_50 = callbacks;
      local_48 = lVar9;
      do {
        piVar1 = *(int **)(lVar9 + lVar7 * 8);
        if (*piVar1 == 1) {
          (*callbacks->on_module_doc)(*(char **)(piVar1 + 2),user_context);
        }
        else if (*piVar1 == 0) {
          puVar2 = *(undefined8 **)(piVar1 + 2);
          piVar1 = (int *)puVar2[2];
          if (*piVar1 == 1) {
            local_38 = *(long *)(piVar1 + 6);
            if (*(int *)(puVar2 + 1) != 1) {
              local_80.type = TMIDL_ITEM_OPAQUE;
              local_80.name = "Top level structure declaration must have a typedef storage class.";
              local_80.doc = (char *)puVar2[4];
              (*callbacks->on_diagnostic)((tmidl_diagnostic_t *)&local_80,user_context);
            }
            if ((char *)puVar2[3] != (char *)0x0) {
              pcVar6 = *(char **)(piVar1 + 2);
              iVar3 = strcmp((char *)puVar2[3],pcVar6);
              if (iVar3 != 0) {
                local_58 = piVar1[4];
                local_80.type = TMIDL_ITEM_OPAQUE;
                local_80.name = "The type specifier name must be the same as the declarator.";
                local_80.doc = (char *)CONCAT44(local_80.doc._4_4_,local_58);
                sVar4 = strlen(pcVar6);
                local_80.doc = (char *)CONCAT44((int)sVar4 + local_58,local_80.doc._0_4_);
                (*local_50->on_diagnostic)((tmidl_diagnostic_t *)&local_80,user_context);
              }
            }
            local_80.type = (tmidl_declaration_type_t)(local_38 != 0);
            local_80.name = *(char **)(piVar1 + 2);
            local_80.doc = (char *)*puVar2;
            local_80.functions = (tmidl_function_t **)0x0;
            local_80.functions_count = 0;
            if (local_38 != 0) {
              uVar10 = (ulong)(int)(*(long **)(piVar1 + 6))[1];
              lVar9 = **(long **)(piVar1 + 6);
              local_80.functions_count = uVar10;
              local_80.functions = (tmidl_function_t **)malloc(uVar10 * 8);
              if (uVar10 != 0) {
                uVar8 = 0;
                do {
                  ptVar5 = (tmidl_function_t *)malloc(8);
                  local_80.functions[uVar8] = ptVar5;
                  local_80.functions[uVar8]->name = *(char **)(*(long *)(lVar9 + uVar8 * 8) + 0x18);
                  uVar8 = uVar8 + 1;
                } while (uVar10 != uVar8);
              }
            }
            callbacks = local_50;
            (*local_50->on_declaration)(&local_80,user_context);
            lVar9 = local_48;
            if (local_80.functions != (tmidl_function_t **)0x0) {
              if (local_80.functions_count != 0) {
                uVar10 = 0;
                do {
                  free(local_80.functions[uVar10]);
                  uVar10 = uVar10 + 1;
                } while (uVar10 < local_80.functions_count);
              }
              free(local_80.functions);
            }
          }
          else {
            lVar9 = local_48;
            if (*piVar1 == 0) {
              local_80.type = TMIDL_ITEM_OPAQUE;
              local_80.name = "Only structure declarations are allowed at the top level.";
              local_80.doc = (char *)puVar2[4];
              (*callbacks->on_diagnostic)((tmidl_diagnostic_t *)&local_80,user_context);
            }
          }
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < (int)((local_40.error)->state).row);
    }
    free_items(local_40.output);
  }
  return local_54 != 0;
}

Assistant:

bool tmidl_parser_parse(
    tmidl_parser_o *parser,
    const char *input,
    const tmidl_callbacks_i *callbacks,
    void *user_context)
{
    // Parse the input
    mpc_result_t r;
    bool success = mpc_parse("input", input, parser->module_parser, &r);

    if (!success) {
        char *message = mpc_err_string(r.error);

        tmidl_diagnostic_t diagnostic;
        diagnostic.level = TMIDL_LEVEL_ERROR;
        diagnostic.message = message;
        diagnostic.position_start = r.error->state.pos;
        diagnostic.position_end = r.error->state.pos + 1;
        callbacks->on_diagnostic(&diagnostic, user_context);

        free(message);
        mpc_err_delete(r.error);
        return false;
    }

    // Pass items to caller
    util_array_t *array = r.output;
    c_item_t **items = array->ptr;

    for (int i = 0; i < array->count; i++) {
        c_item_t *item = items[i];

        switch (item->type) {
        case C_ITEM_TYPE_DECLARATION:
            handle_declaration(((c_item_declaration_t *)item)->declaration, callbacks, user_context);
            break;
        case C_ITEM_TYPE_MODULE_DOC:
            callbacks->on_module_doc(((c_item_module_doc_t *)item)->doc, user_context);
            break;
        }
    }

    // Clean up the parsed items
    free_items(array);

    return true;
}